

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::reserve(Tree *this,size_t cap)

{
  code *pcVar1;
  bool bVar2;
  error_flags eVar3;
  ulong in_RSI;
  long *in_RDI;
  char msg_4 [79];
  char msg_3 [79];
  char msg_2 [36];
  char msg_1 [36];
  char msg [33];
  size_t del;
  size_t first;
  NodeData *buf;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  char *in_stack_fffffffffffffd78;
  Location *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde4;
  undefined1 local_1f8 [8];
  size_t in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  Tree *in_stack_fffffffffffffe20;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  char *local_180;
  undefined1 local_178 [96];
  undefined4 uStack_118;
  undefined4 uStack_114;
  undefined4 local_110;
  undefined4 uStack_10c;
  undefined4 uStack_108;
  undefined4 uStack_104;
  char *local_100;
  undefined1 local_f8 [48];
  undefined4 uStack_c8;
  undefined4 uStack_c4;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  char *local_b0;
  undefined1 local_a8 [48];
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  char *local_60;
  undefined1 local_58 [48];
  long local_28;
  long local_20;
  void *local_18;
  ulong local_10;
  
  if ((ulong)in_RDI[1] < in_RSI) {
    local_10 = in_RSI;
    local_18 = (void *)(*(code *)in_RDI[9])(in_RSI * 0x90,*in_RDI,in_RDI[8]);
    if (*in_RDI != 0) {
      memcpy(local_18,(void *)*in_RDI,in_RDI[1] * 0x90);
      (*(code *)in_RDI[10])(*in_RDI,in_RDI[1] * 0x90,in_RDI[8]);
      *in_RDI = 0;
    }
    local_20 = in_RDI[1];
    local_28 = local_10 - in_RDI[1];
    in_RDI[1] = local_10;
    *in_RDI = (long)local_18;
    _clear_range(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    if (in_RDI[3] == -1) {
      if (in_RDI[4] != -1) {
        memcpy(local_f8,"check failed: (m_free_tail == NONE)",0x24);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = (code *)in_RDI[0xb];
        Location::Location(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        (*pcVar1)(local_f8,0x24,in_RDI[8]);
        in_stack_fffffffffffffd60 = uStack_118;
        in_stack_fffffffffffffd64 = uStack_114;
        in_stack_fffffffffffffd68 = local_110;
        in_stack_fffffffffffffd6c = uStack_10c;
        in_stack_fffffffffffffd70 = uStack_108;
        in_stack_fffffffffffffd74 = uStack_104;
        in_stack_fffffffffffffd78 = local_100;
      }
      in_RDI[3] = local_20;
      in_RDI[4] = local_10 - 1;
    }
    else {
      if (*in_RDI == 0) {
        memcpy(local_58,"check failed: (m_buf != nullptr)",0x21);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = (code *)in_RDI[0xb];
        Location::Location(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        (*pcVar1)(local_58,0x21,in_RDI[8]);
        in_stack_fffffffffffffd60 = uStack_78;
        in_stack_fffffffffffffd64 = uStack_74;
        in_stack_fffffffffffffd68 = local_70;
        in_stack_fffffffffffffd6c = uStack_6c;
        in_stack_fffffffffffffd70 = uStack_68;
        in_stack_fffffffffffffd74 = uStack_64;
        in_stack_fffffffffffffd78 = local_60;
      }
      if (in_RDI[4] == -1) {
        memcpy(local_a8,"check failed: (m_free_tail != NONE)",0x24);
        eVar3 = get_error_flags();
        if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          trap_instruction();
        }
        pcVar1 = (code *)in_RDI[0xb];
        Location::Location(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                           CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                           CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                           CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
        (*pcVar1)(local_a8,0x24,in_RDI[8]);
        in_stack_fffffffffffffd60 = uStack_c8;
        in_stack_fffffffffffffd64 = uStack_c4;
        in_stack_fffffffffffffd68 = local_c0;
        in_stack_fffffffffffffd6c = uStack_bc;
        in_stack_fffffffffffffd70 = uStack_b8;
        in_stack_fffffffffffffd74 = uStack_b4;
        in_stack_fffffffffffffd78 = local_b0;
      }
      *(long *)(*in_RDI + in_RDI[4] * 0x90 + 0x80) = local_20;
      *(long *)(*in_RDI + local_20 * 0x90 + 0x88) = in_RDI[4];
      in_RDI[4] = local_10 - 1;
    }
    if ((in_RDI[3] != -1) && (local_10 <= (ulong)in_RDI[3])) {
      memcpy(local_178,
             "check failed: (m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap))",0x4f);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      Location::Location(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                         CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      (*pcVar1)(local_178,0x4f,in_RDI[8]);
      in_stack_fffffffffffffd60 = uStack_198;
      in_stack_fffffffffffffd64 = uStack_194;
      in_stack_fffffffffffffd68 = local_190;
      in_stack_fffffffffffffd6c = uStack_18c;
      in_stack_fffffffffffffd70 = uStack_188;
      in_stack_fffffffffffffd74 = uStack_184;
      in_stack_fffffffffffffd78 = local_180;
    }
    if ((in_RDI[4] != -1) && (local_10 <= (ulong)in_RDI[4])) {
      memcpy(local_1f8,
             "check failed: (m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap))",0x4f);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = (code *)in_RDI[0xb];
      Location::Location(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,
                         CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                         CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                         CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
      (*pcVar1)(local_1f8,0x4f,in_RDI[8]);
    }
    if (in_RDI[2] == 0) {
      _claim_root((Tree *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
    }
  }
  return;
}

Assistant:

void Tree::reserve(size_t cap)
{
    if(cap > m_cap)
    {
        NodeData *buf = _RYML_CB_ALLOC_HINT(m_callbacks, NodeData, cap, m_buf);
        if(m_buf)
        {
            memcpy(buf, m_buf, m_cap * sizeof(NodeData));
            _RYML_CB_FREE(m_callbacks, m_buf, NodeData, m_cap);
        }
        size_t first = m_cap, del = cap - m_cap;
        m_cap = cap;
        m_buf = buf;
        _clear_range(first, del);
        if(m_free_head != NONE)
        {
            _RYML_CB_ASSERT(m_callbacks, m_buf != nullptr);
            _RYML_CB_ASSERT(m_callbacks, m_free_tail != NONE);
            m_buf[m_free_tail].m_next_sibling = first;
            m_buf[first].m_prev_sibling = m_free_tail;
            m_free_tail = cap-1;
        }
        else
        {
            _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE);
            m_free_head = first;
            m_free_tail = cap-1;
        }
        _RYML_CB_ASSERT(m_callbacks, m_free_head == NONE || (m_free_head >= 0 && m_free_head < cap));
        _RYML_CB_ASSERT(m_callbacks, m_free_tail == NONE || (m_free_tail >= 0 && m_free_tail < cap));

        if( ! m_size)
            _claim_root();
    }
}